

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

int picnic_impl_sign(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t *siglen)

{
  int iVar1;
  rvec_t *__ptr;
  void *__ptr_00;
  mzd_local_t *in_RSI;
  mzd_local_t *in_RDI;
  int ret;
  uint j_13;
  uint j_12;
  uint j_11;
  uint8_t tape_bytes [143];
  uint j_10;
  uint j_9;
  _Bool include_input_size_1;
  uint j_8;
  kdf_shake_t kdfs_1 [3];
  uint j_7;
  uint j_6;
  uint j_5;
  uint j_4;
  uint j_3;
  uint round_offset;
  uint j_2;
  uint j_1;
  uint16_t round_numbers [4];
  uint8_t *seeds [4];
  _Bool include_input_size;
  uint j;
  kdf_shake_x4_t kdfs [3];
  uint i;
  proof_round_t *round;
  uint8_t *tape_bytes_x4;
  rvec_t *rvec;
  in_out_shares_t in_out_shares;
  view_t *views;
  sig_proof_t *prf;
  int check;
  uint8_t public_key [32];
  recorded_state_t *recorded_state;
  zkbpp_lowmc_implementation_f lowmc_impl;
  uint diff;
  uint aview_size;
  uint view_size;
  uint input_output_size;
  uint num_rounds;
  mzd_local_t *in_stack_fffffffffffff140;
  hash_context *in_stack_fffffffffffff148;
  picnic_instance_t *in_stack_fffffffffffff150;
  rvec_t *in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff160;
  uint in_stack_fffffffffffff164;
  uint in_stack_fffffffffffff168;
  uint in_stack_fffffffffffff16c;
  picnic_instance_t *in_stack_fffffffffffff170;
  mzd_local_t *in_stack_fffffffffffff178;
  size_t *in_stack_fffffffffffff180;
  hash_context_x4 *in_stack_fffffffffffff188;
  sig_proof_t *in_stack_fffffffffffff190;
  picnic_context_t *in_stack_fffffffffffff198;
  picnic_instance_t *in_stack_fffffffffffff1a0;
  undefined1 in_stack_fffffffffffff1b3;
  uint16_t in_stack_fffffffffffff1b4;
  uint16_t in_stack_fffffffffffff1b6;
  uint8_t *in_stack_fffffffffffff1b8;
  uint8_t *in_stack_fffffffffffff1c0;
  kdf_shake_t *in_stack_fffffffffffff1c8;
  picnic_instance_t *in_stack_fffffffffffff1d8;
  uint local_e00;
  uint local_dfc;
  uint local_df4;
  uint8_t *in_stack_fffffffffffff230;
  uint8_t *in_stack_fffffffffffff238;
  picnic_context_t *in_stack_fffffffffffff240;
  picnic_instance_t *in_stack_fffffffffffff248;
  uint in_stack_fffffffffffff25c;
  proof_round_t *in_stack_fffffffffffff260;
  undefined5 in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff26d;
  uint16_t in_stack_fffffffffffff26e;
  sig_proof_t *in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff278;
  uint in_stack_fffffffffffff27c;
  proof_round_t *in_stack_fffffffffffff280;
  kdf_shake_x4_t *in_stack_fffffffffffff288;
  picnic_instance_t *in_stack_fffffffffffff298;
  uint local_b48;
  uint local_b44;
  uint local_b40;
  uint local_b3c;
  uint local_b38;
  uint local_b34;
  uint local_b30;
  uint local_b2c;
  uint local_af4;
  uint in_stack_fffffffffffff57c;
  proof_round_t *in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff588;
  uint in_stack_fffffffffffff58c;
  proof_round_t *in_stack_fffffffffffff590;
  picnic_instance_t *in_stack_fffffffffffff598;
  uint local_13c;
  sig_proof_t *local_138;
  in_out_shares_t local_120;
  view_t *local_b8;
  sig_proof_t *local_b0;
  int local_a4;
  undefined1 local_a0 [32];
  recorded_state_t *local_80;
  zkbpp_lowmc_implementation_f local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  mzd_local_t *local_48;
  mzd_local_t *local_40;
  int local_34;
  
  local_5c = (uint)*(ushort *)((long)in_RDI->w64 + 4);
  local_60 = (uint)(byte)in_RDI->w64[1];
  local_64 = (uint)*(byte *)((long)in_RDI->w64 + 9);
  local_68 = local_64 + 7 & 0xfffffff8;
  local_6c = local_60 * 8 - (uint)(ushort)in_RDI->w64[0];
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_78 = get_zkbpp_lowmc_implementation(&in_stack_fffffffffffff150->lowmc);
  local_80 = (recorded_state_t *)
             aligned_alloc(0x20,(long)(int)(*(byte *)((long)local_40->w64 + 3) + 1) << 5);
  lowmc_record_state((lowmc_parameters_t *)
                     CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                     (lowmc_key_t *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                     in_stack_fffffffffffff158->s,(recorded_state_t *)in_stack_fffffffffffff150);
  memset(local_a0,0,0x20);
  mzd_to_char_array((uint8_t *)in_stack_fffffffffffff178,(mzd_local_t *)in_stack_fffffffffffff170,
                    CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
  local_a4 = picnic_timingsafe_bcmp
                       ((void *)local_48[2].w64[2],local_a0,(ulong)(byte)local_40->w64[1]);
  if (local_a4 == 0) {
    local_b0 = proof_new(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    local_b8 = (view_t *)aligned_alloc(0x20,(ulong)*(byte *)((long)local_40->w64 + 3) * 0x60);
    generate_seeds(in_stack_fffffffffffff248,in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                   in_stack_fffffffffffff230);
    __ptr = (rvec_t *)aligned_alloc(0x20,(ulong)*(byte *)((long)local_40->w64 + 3) * 0x60);
    __ptr_00 = (void *)aligned_alloc(8,local_68 * 0xc);
    local_138 = local_b0 + 1;
    for (local_13c = 0; local_13c < (local_5c & 0xfffffffc); local_13c = local_13c + 4) {
      for (local_af4 = 0; local_af4 < 3; local_af4 = local_af4 + 1) {
        in_stack_fffffffffffff140 = local_40;
        kdf_init_x4_from_seed
                  (in_stack_fffffffffffff288,in_stack_fffffffffffff280->seeds,
                   (uint8_t *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                   (uint16_t *)in_stack_fffffffffffff270,in_stack_fffffffffffff26e,
                   (_Bool)in_stack_fffffffffffff26d,in_stack_fffffffffffff298);
      }
      for (local_b2c = 0; local_b2c < 2; local_b2c = local_b2c + 1) {
        hash_squeeze_x4_4(in_stack_fffffffffffff188,(uint8_t *)in_stack_fffffffffffff180,
                          (uint8_t *)in_stack_fffffffffffff178,(uint8_t *)in_stack_fffffffffffff170,
                          (uint8_t *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                          CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
      }
      for (local_b30 = 0; local_b30 < 3; local_b30 = local_b30 + 1) {
        hash_squeeze_x4_4(in_stack_fffffffffffff188,(uint8_t *)in_stack_fffffffffffff180,
                          (uint8_t *)in_stack_fffffffffffff178,(uint8_t *)in_stack_fffffffffffff170,
                          (uint8_t *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                          CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
      }
      for (local_b34 = 0; local_b34 < 4; local_b34 = local_b34 + 1) {
        for (local_b38 = 0; local_b38 < 2; local_b38 = local_b38 + 1) {
          clear_padding_bits((uint8_t *)
                             (*(long *)((long)local_138 +
                                       (ulong)local_b38 * 8 + (ulong)local_b34 * 0x90 + 0x30) +
                             (ulong)(local_60 - 1)),local_6c);
          mzd_from_char_array(in_stack_fffffffffffff178,(uint8_t *)in_stack_fffffffffffff170,
                              CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
        }
        mzd_share((lowmc_parameters_t *)in_stack_fffffffffffff158->s,
                  (mzd_local_t *)in_stack_fffffffffffff150,(mzd_local_t *)in_stack_fffffffffffff148,
                  in_stack_fffffffffffff140,(mzd_local_t *)0x13c393);
        mzd_to_char_array((uint8_t *)in_stack_fffffffffffff178,
                          (mzd_local_t *)in_stack_fffffffffffff170,
                          CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
        for (local_b3c = 0; local_b3c < 3; local_b3c = local_b3c + 1) {
          decompress_random_tape
                    (in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                     (uint8_t *)in_stack_fffffffffffff148,
                     (uint)((ulong)in_stack_fffffffffffff140 >> 0x20));
        }
        (*local_78)(local_48,local_b8,&local_120,__ptr,local_80);
        for (local_b40 = 0; local_b40 < 3; local_b40 = local_b40 + 1) {
          mzd_to_char_array((uint8_t *)in_stack_fffffffffffff178,
                            (mzd_local_t *)in_stack_fffffffffffff170,
                            CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
          compress_view((uint8_t *)in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                        (view_t *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                        in_stack_fffffffffffff164);
        }
      }
      for (local_b44 = 0; local_b44 < 3; local_b44 = local_b44 + 1) {
        hash_commitment_x4((picnic_instance_t *)
                           CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                           in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      }
      if ((local_48[3].w64[1] & 1) != 0) {
        for (local_b48 = 0; local_b48 < 3; local_b48 = local_b48 + 1) {
          unruh_G_x4(in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                     SUB41((uint)in_stack_fffffffffffff588 >> 0x18,0));
        }
      }
      local_138 = (sig_proof_t *)(local_138[0xe].salt + 0x10);
    }
    for (; local_13c < local_5c; local_13c = local_13c + 1) {
      for (local_df4 = 0; local_df4 < 3; local_df4 = local_df4 + 1) {
        in_stack_fffffffffffff140 = local_40;
        kdf_init_from_seed(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                           in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b6,
                           in_stack_fffffffffffff1b4,(_Bool)in_stack_fffffffffffff1b3,
                           in_stack_fffffffffffff1d8);
      }
      for (local_dfc = 0; local_dfc < 2; local_dfc = local_dfc + 1) {
        hash_squeeze(in_stack_fffffffffffff148,(uint8_t *)in_stack_fffffffffffff140,0x13c72c);
        clear_padding_bits((uint8_t *)
                           (*(long *)(local_138[1].salt + (ulong)local_dfc * 8 + 8) +
                           (ulong)(local_60 - 1)),local_6c);
        mzd_from_char_array(in_stack_fffffffffffff178,(uint8_t *)in_stack_fffffffffffff170,
                            CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
      }
      mzd_share((lowmc_parameters_t *)in_stack_fffffffffffff158->s,
                (mzd_local_t *)in_stack_fffffffffffff150,(mzd_local_t *)in_stack_fffffffffffff148,
                in_stack_fffffffffffff140,(mzd_local_t *)0x13c7e2);
      mzd_to_char_array((uint8_t *)in_stack_fffffffffffff178,
                        (mzd_local_t *)in_stack_fffffffffffff170,
                        CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
      for (local_e00 = 0; local_e00 < 3; local_e00 = local_e00 + 1) {
        hash_squeeze(in_stack_fffffffffffff148,(uint8_t *)in_stack_fffffffffffff140,0x13c849);
        decompress_random_tape
                  (in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                   (uint8_t *)in_stack_fffffffffffff148,
                   (uint)((ulong)in_stack_fffffffffffff140 >> 0x20));
      }
      for (in_stack_fffffffffffff16c = 0; in_stack_fffffffffffff16c < 3;
          in_stack_fffffffffffff16c = in_stack_fffffffffffff16c + 1) {
      }
      (*local_78)(local_48,local_b8,&local_120,__ptr,local_80);
      for (in_stack_fffffffffffff168 = 0; in_stack_fffffffffffff168 < 3;
          in_stack_fffffffffffff168 = in_stack_fffffffffffff168 + 1) {
        mzd_to_char_array((uint8_t *)in_stack_fffffffffffff178,
                          (mzd_local_t *)in_stack_fffffffffffff170,
                          CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
        compress_view((uint8_t *)in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                      (view_t *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
                      in_stack_fffffffffffff164);
        hash_commitment((picnic_instance_t *)
                        CONCAT26(in_stack_fffffffffffff26e,
                                 CONCAT15(in_stack_fffffffffffff26d,in_stack_fffffffffffff268)),
                        in_stack_fffffffffffff260,in_stack_fffffffffffff25c);
      }
      if ((local_48[3].w64[1] & 1) != 0) {
        for (in_stack_fffffffffffff164 = 0; in_stack_fffffffffffff164 < 3;
            in_stack_fffffffffffff164 = in_stack_fffffffffffff164 + 1) {
          unruh_G((picnic_instance_t *)in_stack_fffffffffffff288,in_stack_fffffffffffff280,
                  in_stack_fffffffffffff27c,SUB41((uint)in_stack_fffffffffffff278 >> 0x18,0));
        }
      }
      local_138 = (sig_proof_t *)(local_138[3].salt + 0x18);
    }
    H3((picnic_instance_t *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
       in_stack_fffffffffffff270,
       (picnic_context_t *)
       CONCAT26(in_stack_fffffffffffff26e,
                CONCAT15(in_stack_fffffffffffff26d,in_stack_fffffffffffff268)));
    iVar1 = sig_proof_to_char_array
                      ((picnic_instance_t *)in_stack_fffffffffffff198,in_stack_fffffffffffff190,
                       (uint8_t *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
    free(__ptr_00);
    free(__ptr);
    free(local_b8);
    proof_free((sig_proof_t *)0x13ca60);
    free(local_80);
    local_34 = iVar1;
  }
  else {
    free(local_80);
    local_34 = -2;
  }
  return local_34;
}

Assistant:

int picnic_impl_sign(const picnic_instance_t* pp, const picnic_context_t* context, uint8_t* sig,
                     size_t* siglen) {
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_implementation_f lowmc_impl = get_zkbpp_lowmc_implementation(&pp->lowmc);

  // Perform LowMC evaluation and record state before AND gates
  recorded_state_t* recorded_state =
      picnic_aligned_alloc(32, sizeof(recorded_state_t) * (pp->lowmc.r + 1));
  lowmc_record_state(&pp->lowmc, context->m_key, context->m_plaintext, recorded_state);
  // Validate public key
  {
    uint8_t public_key[MAX_LOWMC_BLOCK_SIZE] = {0};
    mzd_to_char_array(public_key, recorded_state[pp->lowmc.r].state, pp->input_output_size);
    const int check =
        picnic_timingsafe_bcmp(context->public_key, &public_key, pp->input_output_size);
    // check encodes the consistency of the embedded public key with the secret key and is safe to
    // leak.
    picnic_declassify(&check, sizeof(check));
    if (check) {
      picnic_aligned_free(recorded_state);
      return -2;
    }
  }

  sig_proof_t* prf = proof_new(pp, context);
  view_t* views    = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);

  in_out_shares_t in_out_shares;

  // Generate seeds
  generate_seeds(pp, context, prf->round[0].seeds[0], prf->salt);

  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for AND-gates
  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_PROOF * 4 * aview_size);

  proof_round_t* round = prf->round;
  unsigned int i       = 0;
  for (; i < (num_rounds / 4) * 4; i += 4, round += 4) {
    // use 4 parallel instances of keccak for speedup
    {
      kdf_shake_x4_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size   = (j != SC_PROOF - 1);
        const uint8_t* seeds[4]         = {round[0].seeds[j], round[1].seeds[j], round[2].seeds[j],
                                           round[3].seeds[j]};
        const uint16_t round_numbers[4] = {i, i + 1, i + 2, i + 3};
        kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], round[0].input_shares[j], round[1].input_shares[j],
                                      round[2].input_shares[j], round[3].input_shares[j],
                                      input_output_size);
      }
      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
        kdf_shake_x4_clear(&kdfs[j]);
      }
    }

    for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        clear_padding_bits(&round[round_offset].input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round[round_offset].input_shares[j],
                            input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round[round_offset].input_shares[SC_PROOF - 1],
                        in_out_shares.s[SC_PROOF - 1], input_output_size);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
      }

      // perform ZKB++ LowMC evaluation
      lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        mzd_to_char_array(round[round_offset].output_shares[j], in_out_shares.s[j],
                          input_output_size);
        compress_view(round[round_offset].communicated_bits[j], pp, views, j);
      }
    }

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      hash_commitment_x4(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G_x4(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  for (; i < num_rounds; ++i, ++round) {
    {
      kdf_shake_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size = (j != SC_PROOF - 1);
        kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, i, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_get_randomness(&kdfs[j], round->input_shares[j], input_output_size);
        clear_padding_bits(&round->input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round->input_shares[j], input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round->input_shares[SC_PROOF - 1], in_out_shares.s[SC_PROOF - 1],
                        input_output_size);

      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        assert(view_size <= MAX_VIEW_SIZE);
        uint8_t tape_bytes[MAX_VIEW_SIZE];
        kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
        decompress_random_tape(rvec, pp, tape_bytes, j);
      }

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_clear(&kdfs[j]);
      }
    }

    // perform ZKB++ LowMC evaluation
    lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
      compress_view(round->communicated_bits[j], pp, views, j);
      hash_commitment(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  H3(pp, prf, context);

  const int ret = sig_proof_to_char_array(pp, prf, sig, siglen);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);
  proof_free(prf);
  picnic_aligned_free(recorded_state);
  return ret;
}